

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

OPTIONHANDLER_HANDLE twin_messenger_retrieve_options(TWIN_MESSENGER_HANDLE twin_msgr_handle)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  TWIN_MESSENGER_HANDLE twin_msgr_handle_local;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_retrieve_options",0x82c,1,
                "Invalid argument (twin_msgr_handle is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)amqp_messenger_retrieve_options(twin_msgr_handle->amqp_msgr);
    if (((OPTIONHANDLER_HANDLE)l == (OPTIONHANDLER_HANDLE)0x0) &&
       (p_Var1 = xlogging_get_log_function(), p_Var1 != (LOGGER_LOG)0x0)) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_retrieve_options",0x835,1,"Failed TWIN messenger options (%s)",
                twin_msgr_handle->device_id);
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

OPTIONHANDLER_HANDLE twin_messenger_retrieve_options(TWIN_MESSENGER_HANDLE twin_msgr_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (twin_msgr_handle == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle is NULL)");
        result = NULL;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;

        if ((result = amqp_messenger_retrieve_options(twin_msgr->amqp_msgr)) == NULL)
        {
            LogError("Failed TWIN messenger options (%s)", twin_msgr->device_id);
        }
    }

    return result;
}